

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_StageERKFast(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int is)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double t0_00;
  MRIStepInnerStepper stepper;
  int retval;
  realtype t0;
  realtype cdiff;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  t0_00 = *(double *)(*(long *)(*(long *)(in_RSI + 0x38) + 0x10) + (long)(in_EDX + -1) * 8) *
          *(double *)(in_RDI + 0x168) + *(double *)(in_RDI + 0x230);
  stepper = (MRIStepInnerStepper)
            (*(double *)(*(long *)(*(long *)(in_RSI + 0x38) + 0x10) + (long)in_EDX * 8) -
            *(double *)(*(long *)(*(long *)(in_RSI + 0x38) + 0x10) + (long)(in_EDX + -1) * 8));
  iVar1 = mriStep_ComputeInnerForcing
                    ((ARKodeMRIStepMem)t0,retval,
                     (realtype)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == 0) {
    *(double *)(*(long *)(in_RSI + 0x150) + 0x28) = t0_00;
    *(double *)(*(long *)(in_RSI + 0x150) + 0x30) = (double)stepper * *(double *)(in_RDI + 0x168);
    if ((*(long *)(in_RSI + 0x158) == 0) ||
       (iVar1 = (**(code **)(in_RSI + 0x158))
                          (t0_00,*(undefined8 *)(*(long *)(in_RSI + 0x150) + 0x18),
                           *(undefined4 *)(*(long *)(in_RSI + 0x150) + 0x20),
                           *(undefined8 *)(in_RDI + 0x10)), iVar1 == 0)) {
      iVar1 = mriStepInnerStepper_Evolve
                        (stepper,t0_00,(realtype)(ulong)in_stack_ffffffffffffffc8,(N_Vector)0xeb9f7b
                        );
      if (iVar1 < 0) {
        iVar1 = -0x22;
      }
      else if ((*(long *)(in_RSI + 0x160) == 0) ||
              (iVar1 = (**(code **)(in_RSI + 0x160))
                                 (*(undefined8 *)(in_RDI + 0x198),*(undefined8 *)(in_RDI + 0x108),
                                  *(undefined8 *)(in_RDI + 0x10)), iVar1 == 0)) {
        iVar1 = 0;
      }
      else {
        iVar1 = -0x24;
      }
    }
    else {
      iVar1 = -0x23;
    }
  }
  return iVar1;
}

Assistant:

int mriStep_StageERKFast(ARKodeMem ark_mem,
                         ARKodeMRIStepMem step_mem, int is)
{
  realtype cdiff;    /* stage time increment */
  realtype t0;       /* start time for stage */
  int retval;        /* reusable return flag */

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep ERK fast stage\n");
#endif

  /* Set initial time for fast evolution */
  t0 = ark_mem->tn + step_mem->MRIC->c[is-1]*ark_mem->h;

  /* compute the inner forcing */
  cdiff = step_mem->MRIC->c[is] - step_mem->MRIC->c[is-1];
  retval = mriStep_ComputeInnerForcing(step_mem, is, cdiff);
  if (retval != ARK_SUCCESS) return(retval);

  /* Set inner forcing time normalization constants */
  step_mem->stepper->tshift = t0;
  step_mem->stepper->tscale = cdiff * ark_mem->h;

  /* pre inner evolve function (if supplied) */
  if (step_mem->pre_inner_evolve) {
    retval = step_mem->pre_inner_evolve(t0, step_mem->stepper->forcing,
                                        step_mem->stepper->nforcing,
                                        ark_mem->user_data);
    if (retval != 0) return(ARK_OUTERTOINNER_FAIL);
  }

  /* advance inner method in time */
  retval = mriStepInnerStepper_Evolve(step_mem->stepper, t0, ark_mem->tcur,
                                      ark_mem->ycur);
  if (retval < 0) return(ARK_INNERSTEP_FAIL);

  /* post inner evolve function (if supplied) */
  if (step_mem->post_inner_evolve) {
    retval = step_mem->post_inner_evolve(ark_mem->tcur, ark_mem->ycur,
                                         ark_mem->user_data);
    if (retval != 0) return(ARK_INNERTOOUTER_FAIL);
  }

  /* return with success */
  return(ARK_SUCCESS);
}